

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::isCoreTester
               (ContextType *contextType,TesterType tester)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (bVar1) {
    if (TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER < tester) {
LAB_014d7134:
      bVar2 = 0;
      goto LAB_014d7136;
    }
    uVar3 = 0x1e3ffffffffffff;
  }
  else {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (bVar1) {
      bVar2 = (byte)(0x649249249249 >> ((byte)tester & 0x3f)) &
              tester < TESTER_DEPTH_STENCIL_TEXTURE_MODE |
              tester == TESTER_DEPTH_STENCIL_TEXTURE_MODE;
      goto LAB_014d7136;
    }
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
    if (!bVar1 || TESTER_TEXTURE_IMMUTABLE_FORMAT < tester) goto LAB_014d7134;
    uVar3 = 0x649249249249;
  }
  bVar2 = (byte)(uVar3 >> ((byte)tester & 0x3f));
LAB_014d7136:
  return (bool)(bVar2 & 1);
}

Assistant:

static bool isCoreTester (const glu::ContextType& contextType, TesterType tester)
{
	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::isCoreTester(tester);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::isCoreTester(tester);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::isCoreTester(tester);
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}